

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flattening.cpp
# Opt level: O0

Literal * Shell::Flattening::flatten(Literal *l)

{
  bool bVar1;
  bool bVar2;
  Stack<Kernel::TermList> *in_RDI;
  TermList flattenedArgument;
  TermList argument;
  Iterator terms;
  Stack<Kernel::TermList> args;
  bool flattened;
  TermList in_stack_000001f8;
  Term *in_stack_ffffffffffffff58;
  TermList in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  TermList local_60;
  TermList local_58 [5];
  TermList *in_stack_ffffffffffffffd0;
  Literal *in_stack_ffffffffffffffd8;
  Stack<Kernel::TermList> *local_8;
  
  bVar1 = Kernel::Term::shared((Term *)0xb986ac);
  local_8 = in_RDI;
  if (!bVar1) {
    bVar1 = false;
    Lib::Stack<Kernel::TermList>::Stack
              ((Stack<Kernel::TermList> *)
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    Kernel::Term::Iterator::Iterator
              ((Iterator *)in_stack_ffffffffffffff60._content,in_stack_ffffffffffffff58);
    while (bVar2 = Kernel::Term::Iterator::hasNext((Iterator *)0xb986fd), bVar2) {
      local_58[0] = Kernel::Term::Iterator::next((Iterator *)in_stack_ffffffffffffff58);
      local_60 = flatten(in_stack_000001f8);
      bVar2 = Kernel::TermList::operator!=(local_58,&local_60);
      if (bVar2) {
        bVar1 = true;
      }
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
    }
    if (bVar1) {
      Lib::Stack<Kernel::TermList>::begin((Stack<Kernel::TermList> *)(local_58 + 4));
      local_8 = (Stack<Kernel::TermList> *)
                Kernel::Literal::create(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      in_stack_ffffffffffffff60._content = (uint64_t)in_RDI;
    }
    Lib::Stack<Kernel::TermList>::~Stack
              ((Stack<Kernel::TermList> *)in_stack_ffffffffffffff60._content);
  }
  return (Literal *)local_8;
}

Assistant:

Literal* Flattening::flatten(Literal* l)
{
  if (l->shared()) {
    return l;
  }

  bool flattened = false;
  Stack<TermList> args;
  Term::Iterator terms(l);
  while (terms.hasNext()) {
    TermList argument = terms.next();
    TermList flattenedArgument = flatten(argument);
    if (argument != flattenedArgument) {
      flattened = true;
    }
    args.push(flattenedArgument);
  }

  if (!flattened) {
    return l;
  }

  return Literal::create(l, args.begin());
}